

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::B_formatter::format
          (B_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  fmt_helper *this_00;
  char *wrapped_size;
  memory_buffer *dest_00;
  string_view_t view;
  scoped_pad p;
  scoped_pad sStack_48;
  
  this_00 = *(fmt_helper **)(full_months + (long)tm_time->tm_mon * 8);
  wrapped_size = (char *)strlen((char *)this_00);
  dest_00 = dest;
  scoped_pad::scoped_pad
            (&sStack_48,(size_t)wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = wrapped_size;
  fmt_helper::append_string_view<500ul>(this_00,view,dest_00);
  scoped_pad::~scoped_pad(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        string_view_t field_value{full_months[tm_time.tm_mon]};
        scoped_pad p(field_value, padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }